

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::setComboBoxText(QInputDialogPrivate *this,QString *text)

{
  bool bVar1;
  int index;
  
  index = QComboBox::findText(this->comboBox,text,(MatchFlags)0x10);
  if (index != -1) {
    QComboBox::setCurrentIndex(this->comboBox,index);
    return;
  }
  bVar1 = QComboBox::isEditable(this->comboBox);
  if (bVar1) {
    QComboBox::setEditText(this->comboBox,text);
    return;
  }
  return;
}

Assistant:

void QInputDialogPrivate::setComboBoxText(const QString &text)
{
    int index = comboBox->findText(text);
    if (index != -1) {
        comboBox->setCurrentIndex(index);
    } else if (comboBox->isEditable()) {
        comboBox->setEditText(text);
    }
}